

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

Gls_Man_t * Gls_ManAlloc(Vec_Str_t *vLines,int *pCounts)

{
  int iVar1;
  Gls_Man_t *pGVar2;
  Vec_Str_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  Vec_Wec_t *pVVar6;
  Gls_Man_t *p;
  int *pCounts_local;
  Vec_Str_t *vLines_local;
  
  pGVar2 = (Gls_Man_t *)calloc(1,0x88);
  pGVar2->vLines = vLines;
  iVar1 = Vec_StrSize(vLines);
  pVVar3 = Vec_StrStart(iVar1 + 100);
  pGVar2->vTypes = pVVar3;
  iVar1 = Vec_StrSize(vLines);
  pVVar4 = Vec_IntStart(iVar1 + 100);
  pGVar2->vIndexes = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[7] << 2);
  pGVar2->vLut4s = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[7]);
  pGVar2->vLut4TTs = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[8] * 6);
  pGVar2->vLut6s = pVVar4;
  pVVar5 = Vec_WrdAlloc(pCounts[8]);
  pGVar2->vLut6TTs = pVVar5;
  pVVar4 = Vec_IntAlloc(pCounts[9] * 5);
  pGVar2->vBoxes = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[10]);
  pGVar2->vDelays = pVVar4;
  pVVar6 = Vec_WecAlloc(pCounts[10]);
  pGVar2->vDelayIns = pVVar6;
  pVVar6 = Vec_WecAlloc(pCounts[10]);
  pGVar2->vDelayOuts = pVVar6;
  pVVar4 = Vec_IntAlloc(pCounts[2]);
  pGVar2->vOrderPis = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[3]);
  pGVar2->vOrderPos = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[9]);
  pGVar2->vOrderBoxes = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[10]);
  pGVar2->vOrderDelays = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[7] + pCounts[8] + pCounts[4] * 2);
  pGVar2->vOrderLuts = pVVar4;
  pVVar4 = Vec_IntAlloc(pCounts[5]);
  pGVar2->vOrderSeqs = pVVar4;
  return pGVar2;
}

Assistant:

Gls_Man_t * Gls_ManAlloc( Vec_Str_t * vLines, int * pCounts )
{
    Gls_Man_t * p = ABC_CALLOC( Gls_Man_t, 1 );
    p->vLines     = vLines;
    p->vTypes     = Vec_StrStart( Vec_StrSize(vLines)+100 ); 
    p->vIndexes   = Vec_IntStart( Vec_StrSize(vLines)+100 ); 
    p->vLut4s     = Vec_IntAlloc( 4 * pCounts[GLS_LUT4] );
    p->vLut4TTs   = Vec_IntAlloc( pCounts[GLS_LUT4] );
    p->vLut6s     = Vec_IntAlloc( 6 * pCounts[GLS_LUT6] );
    p->vLut6TTs   = Vec_WrdAlloc( pCounts[GLS_LUT6] );
    p->vBoxes     = Vec_IntAlloc( 5 * pCounts[GLS_BOX] );
    p->vDelays    = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vDelayIns  = Vec_WecAlloc( pCounts[GLS_DEL] );
    p->vDelayOuts = Vec_WecAlloc( pCounts[GLS_DEL] );
    // ordering
    p->vOrderPis    = Vec_IntAlloc( pCounts[GLS_PI] );
    p->vOrderPos    = Vec_IntAlloc( pCounts[GLS_PO] );
    p->vOrderBoxes  = Vec_IntAlloc( pCounts[GLS_BOX] );
    p->vOrderDelays = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vOrderLuts   = Vec_IntAlloc( pCounts[GLS_LUT4] + pCounts[GLS_LUT6] + 2*pCounts[GLS_BAR] );
    p->vOrderSeqs   = Vec_IntAlloc( pCounts[GLS_SEQ] );
    return p;
}